

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# post.cpp
# Opt level: O0

void __thiscall Post::post_with_body::test_method(post_with_body *this)

{
  undefined8 uVar1;
  bool bVar2;
  RequestDsl *pRVar3;
  lazy_ostream *prev;
  string local_640;
  string local_620;
  basic_cstring<const_char> local_600;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5f0;
  basic_cstring<const_char> local_5c8;
  basic_cstring<const_char> local_5b8;
  allocator<char> local_5a1;
  string local_5a0;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  RequestDsl local_318;
  undefined1 local_298 [8];
  Request should;
  Request result;
  char text [392];
  post_with_body *this_local;
  
  memcpy(&result.keepAlive,
         "POST /uri.cgi HTTP/1.1\r\nFrom: user@example.com\r\nUser-Agent: Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0\r\nAccept: text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8\r\nAccept-Language: en-US,en;q=0.5\r\nAccept-Encoding: gzip, deflate\r\nContent-Type: application/x-www-form-urlencoded\r\nContent-Length: 31\r\nHost: 127.0.0.1\r\n\r\narg1=test;arg1=%20%21;arg3=test"
         ,0x188);
  PostFixture::parse((Request *)&should.keepAlive,(PostFixture *)this,&result.keepAlive,0x188);
  local_318.request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
  local_318.request.keepAlive = false;
  local_318.request._121_7_ = 0;
  local_318.request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Tp_alloc_type = (_Tp_alloc_type)0x0;
  local_318.request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl._1_7_ = 0;
  local_318.request.content.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_8_ = 0;
  local_318.request.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.request.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.request.versionMajor = 0;
  local_318.request.versionMinor = 0;
  local_318.request.headers.
  super__Vector_base<httpparser::Request::HeaderItem,_std::allocator<httpparser::Request::HeaderItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.request.uri.field_2._M_allocated_capacity = 0;
  local_318.request.uri.field_2._8_8_ = 0;
  local_318.request.uri._M_dataplus = (_Alloc_hider)0x0;
  local_318.request.uri._1_7_ = 0;
  local_318.request.uri._M_string_length = 0;
  local_318.request.method.field_2._M_allocated_capacity = 0;
  local_318.request.method.field_2._8_8_ = 0;
  local_318.request.method._M_dataplus = (_Alloc_hider)0x0;
  local_318.request.method._1_7_ = 0;
  local_318.request.method._M_string_length = 0;
  RequestDsl::RequestDsl(&local_318);
  pRVar3 = RequestDsl::method(&local_318,"POST");
  pRVar3 = RequestDsl::uri(pRVar3,"/uri.cgi");
  pRVar3 = RequestDsl::version(pRVar3,1,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"From",&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"user@example.com",&local_371);
  pRVar3 = RequestDsl::header(pRVar3,&local_348,&local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"User-Agent",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,
             "Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0",&local_3c1);
  pRVar3 = RequestDsl::header(pRVar3,&local_398,&local_3c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"Accept",&local_3e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8",
             &local_411);
  pRVar3 = RequestDsl::header(pRVar3,&local_3e8,&local_410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"Accept-Language",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"en-US,en;q=0.5",&local_461);
  pRVar3 = RequestDsl::header(pRVar3,&local_438,&local_460);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"Accept-Encoding",&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"gzip, deflate",&local_4b1);
  pRVar3 = RequestDsl::header(pRVar3,&local_488,&local_4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"Content-Type",&local_4d9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_500,"application/x-www-form-urlencoded",&local_501);
  pRVar3 = RequestDsl::header(pRVar3,&local_4d8,&local_500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"Content-Length",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"31",&local_551);
  pRVar3 = RequestDsl::header(pRVar3,&local_528,&local_550);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"Host",&local_579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a0,"127.0.0.1",&local_5a1);
  pRVar3 = RequestDsl::header(pRVar3,&local_578,&local_5a0);
  pRVar3 = RequestDsl::content<32ul>(pRVar3,(char (*) [32])"arg1=test;arg1=%20%21;arg3=test");
  pRVar3 = RequestDsl::keepAlive(pRVar3,true);
  RequestDsl::operator_cast_to_Request((Request *)local_298,pRVar3);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator(&local_439);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  RequestDsl::~RequestDsl(&local_318);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b8,
               "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/post.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5b8,0x3e,&local_5c8);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5f0,prev,(char (*) [1])0x1172aa);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_600,
               "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/post.cpp"
               ,0x57);
    httpparser::Request::inspect_abi_cxx11_(&local_620,(Request *)&should.keepAlive);
    httpparser::Request::inspect_abi_cxx11_(&local_640,(Request *)local_298);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_5f0,&local_600,0x3e,1,2,&local_620,"result.inspect()",&local_640,
               "should.inspect()");
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_620);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5f0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  httpparser::Request::~Request((Request *)local_298);
  httpparser::Request::~Request((Request *)&should.keepAlive);
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(post_with_body, PostFixture)
{
    const char text[] = "POST /uri.cgi HTTP/1.1\r\n"
                        "From: user@example.com\r\n"
                        "User-Agent: Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0\r\n"
                        "Accept: text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8\r\n"
                        "Accept-Language: en-US,en;q=0.5\r\n"
                        "Accept-Encoding: gzip, deflate\r\n"
                        "Content-Type: application/x-www-form-urlencoded\r\n"
                        "Content-Length: 31\r\n"
                        "Host: 127.0.0.1\r\n"
                        "\r\n"
                        "arg1=test;arg1=%20%21;arg3=test";
                       
    Request result = parse(text, sizeof(text));
    Request should = RequestDsl()
            .method("POST")
            .uri("/uri.cgi")
            .version(1, 1)
            .header("From", "user@example.com")
            .header("User-Agent", "Mozilla/5.0 (Windows NT 6.1; WOW64; rv:18.0) Gecko/20100101 Firefox/18.0")
            .header("Accept", "text/html,application/xhtml+xml,application/xml;q=0.9,*/*;q=0.8")
            .header("Accept-Language", "en-US,en;q=0.5")
            .header("Accept-Encoding", "gzip, deflate")
            .header("Content-Type", "application/x-www-form-urlencoded")
            .header("Content-Length", "31")
            .header("Host", "127.0.0.1")
            .content("arg1=test;arg1=%20%21;arg3=test")
            .keepAlive(true);
    
    BOOST_CHECK_EQUAL(result.inspect(), should.inspect());
}